

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_in_memory.h
# Opt level: O2

void __thiscall
directed_flag_complex_in_memory_t<std::pair<int,_float>_>::directed_flag_complex_in_memory_t
          (directed_flag_complex_in_memory_t<std::pair<int,_float>_> *this,directed_graph_t *graph,
          size_t nb_threads,int max_dimension)

{
  ostream *poVar1;
  vertex_index_t index;
  ushort uVar2;
  unsigned_long i;
  ulong uVar3;
  vector<std::thread,_std::allocator<std::thread>_> t;
  int local_7c;
  ulong local_78;
  size_t local_70;
  directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_> local_68;
  directed_graph_t *local_50;
  directed_flag_complex_in_memory_t<std::pair<int,_float>_> *local_48;
  _func_void_int_int_directed_flag_complex_in_memory_t<std::pair<int,_float>_>_ptr_directed_graph_t_ptr_int
  *local_40;
  thread local_38;
  
  (this->vertex_cells).
  super__Vector_base<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vertex_cells).
  super__Vector_base<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vertex_cells).
  super__Vector_base<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->nb_threads = nb_threads;
  local_7c = max_dimension;
  local_70 = nb_threads;
  poVar1 = std::operator<<((ostream *)&std::cout,"\x1b[K");
  std::operator<<(poVar1,"constructing the directed flag complex");
  poVar1 = (ostream *)std::ostream::flush();
  std::operator<<(poVar1,"\r");
  std::
  vector<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
  ::reserve(&this->vertex_cells,(ulong)graph->number_of_vertices);
  for (uVar2 = 0; uVar2 < graph->number_of_vertices; uVar2 = uVar2 + 1) {
    local_68.data.first = 0;
    local_68.data.second = 0.0;
    local_68.children =
         (map<unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>_>
          *)0x0;
    local_68.vertex = uVar2;
    std::
    vector<directed_flag_complex_cell_in_memory_t<std::pair<int,float>>,std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,float>>>>
    ::emplace_back<directed_flag_complex_cell_in_memory_t<std::pair<int,float>>>
              ((vector<directed_flag_complex_cell_in_memory_t<std::pair<int,float>>,std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,float>>>>
                *)this,&local_68);
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)&local_68,nb_threads - 1,
             (allocator_type *)&local_78);
  for (local_78 = 0; local_78 < nb_threads - 1; local_78 = local_78 + 1) {
    local_40 = construction_worker_thread<std::pair<int,float>>;
    local_50 = graph;
    local_48 = this;
    std::thread::
    thread<void(*)(int,int,directed_flag_complex_in_memory_t<std::pair<int,float>>*,directed_graph_t_const*,int),unsigned_long_const&,unsigned_long&,directed_flag_complex_in_memory_t<std::pair<int,float>>*,directed_graph_t_const*,int&,void>
              (&local_38,&local_40,&local_70,&local_78,&local_48,&local_50,&local_7c);
    std::thread::operator=
              ((thread *)
               (local_78 * 8 +
               CONCAT44(local_68.data.first,CONCAT22(local_68._2_2_,local_68.vertex))),&local_38);
    std::thread::~thread(&local_38);
    nb_threads = local_70;
  }
  construction_worker_thread<std::pair<int,float>>
            ((int)nb_threads,(int)nb_threads + -1,this,graph,local_7c);
  for (uVar3 = 0; uVar3 < local_70 - 1; uVar3 = uVar3 + 1) {
    std::thread::join();
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)&local_68);
  return;
}

Assistant:

directed_flag_complex_in_memory_t<ExtraData>::directed_flag_complex_in_memory_t(const directed_graph_t& graph,
                                                                                const size_t nb_threads,
                                                                                int max_dimension)
    : nb_threads(nb_threads) {
#ifdef INDICATE_PROGRESS
	std::cout << "\033[K"
	          << "constructing the directed flag complex" << std::flush << "\r";
#endif

	// First we add the vertices of the directed flag complex
	vertex_cells.reserve(graph.number_of_vertices);
	for (vertex_index_t index = 0; index < graph.number_of_vertices; index++)
		vertex_cells.push_back(directed_flag_complex_cell_in_memory_t<ExtraData>(index));

	// Now we start a few threads to construct the flag complex
	std::vector<std::thread> t(nb_threads - 1);

	for (auto index = 0ul; index < nb_threads - 1; ++index)
		t[index] = std::thread(&construction_worker_thread<ExtraData>, nb_threads, index, this, &graph, max_dimension);

	// Also do work in this thread, namely the last bit
	// For this last thread, take all the remaining vertices
	construction_worker_thread(nb_threads, nb_threads - 1, this, &graph, max_dimension);

	// Wait until all threads stopped
	for (auto i = 0ul; i < nb_threads - 1; ++i) t[i].join();
}